

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_A_ParamSet.c
# Opt level: O1

void fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry(uint64_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (*arg1 >> 0x34) + arg1[1];
  uVar1 = (uVar2 >> 0x33) + arg1[2];
  uVar3 = (uVar1 >> 0x33) + arg1[3];
  uVar4 = (uVar3 >> 0x33) + arg1[4];
  uVar5 = (uVar4 >> 0x33) * 0x269 + (*arg1 & 0xfffffffffffff);
  uVar2 = (uVar2 & 0x7ffffffffffff) + (uVar5 >> 0x34);
  *out1 = uVar5 & 0xfffffffffffff;
  out1[1] = uVar2 & 0x7ffffffffffff;
  out1[2] = (uVar1 & 0x7ffffffffffff) + (uVar2 >> 0x33);
  out1[3] = uVar3 & 0x7ffffffffffff;
  out1[4] = uVar4 & 0x7ffffffffffff;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry(
    uint64_t out1[5], const uint64_t arg1[5]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    x1 = (arg1[0]);
    x2 = ((x1 >> 52) + (arg1[1]));
    x3 = ((x2 >> 51) + (arg1[2]));
    x4 = ((x3 >> 51) + (arg1[3]));
    x5 = ((x4 >> 51) + (arg1[4]));
    x6 = ((x1 & UINT64_C(0xfffffffffffff)) + (UINT16_C(0x269) * (x5 >> 51)));
    x7 = ((fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1)(x6 >> 52) +
          (x2 & UINT64_C(0x7ffffffffffff)));
    x8 = (x6 & UINT64_C(0xfffffffffffff));
    x9 = (x7 & UINT64_C(0x7ffffffffffff));
    x10 = ((fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1)(x7 >> 51) +
           (x3 & UINT64_C(0x7ffffffffffff)));
    x11 = (x4 & UINT64_C(0x7ffffffffffff));
    x12 = (x5 & UINT64_C(0x7ffffffffffff));
    out1[0] = x8;
    out1[1] = x9;
    out1[2] = x10;
    out1[3] = x11;
    out1[4] = x12;
}